

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall TTD::EventLog::PopMode(EventLog *this,TTDMode m)

{
  TTDMode TVar1;
  
  if ((((0x3f < m - CurrentlyEnabled) ||
       ((0x8000000080000081U >> ((ulong)(m - CurrentlyEnabled) & 0x3f) & 1) == 0)) &&
      (m != DebuggerSuppressGetter)) &&
     ((m != DebuggerSuppressBreakpoints && (m != DebuggerLogBreakpoints)))) {
    TTDAbort_unrecoverable_error("These are the only valid mode modifiers to pop");
  }
  TVar1 = TTModeStack::Peek(&this->m_modeStack);
  if (TVar1 == m) {
    TTModeStack::Pop(&this->m_modeStack);
    UpdateComputedMode(this);
    return;
  }
  TTDAbort_unrecoverable_error("Push/Pop is not matched so something went wrong.");
}

Assistant:

void EventLog::PopMode(TTDMode m)
    {
        TTDAssert(m == TTDMode::DebuggerAttachedMode || m == TTDMode::CurrentlyEnabled || m == TTDMode::ExcludedExecutionTTAction || m == TTDMode::ExcludedExecutionDebuggerAction ||
            m == TTDMode::DebuggerSuppressGetter || m == TTDMode::DebuggerSuppressBreakpoints || m == TTDMode::DebuggerLogBreakpoints, "These are the only valid mode modifiers to pop");
        TTDAssert(this->m_modeStack.Peek() == m, "Push/Pop is not matched so something went wrong.");

        this->m_modeStack.Pop();
        this->UpdateComputedMode();
    }